

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O0

void Sbl_ManPrintRuntime(Sbl_Man_t *p)

{
  double local_a0;
  double local_90;
  double local_80;
  double local_70;
  double local_60;
  double local_50;
  double local_40;
  double local_30;
  double local_20;
  Sbl_Man_t *p_local;
  
  printf("Runtime breakdown:\n");
  p->timeOther = (((p->timeTotal - p->timeWin) - p->timeCut) - p->timeSat) - p->timeTime;
  Abc_Print(1,"%s =","Win   ");
  if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
    local_20 = ((double)p->timeWin * 100.0) / (double)p->timeTotal;
  }
  else {
    local_20 = 0.0;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeWin * 1.0) / 1000000.0,local_20);
  Abc_Print(1,"%s =","Cut   ");
  if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
    local_30 = ((double)p->timeCut * 100.0) / (double)p->timeTotal;
  }
  else {
    local_30 = 0.0;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeCut * 1.0) / 1000000.0,local_30);
  Abc_Print(1,"%s =","Sat   ");
  if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
    local_40 = ((double)p->timeSat * 100.0) / (double)p->timeTotal;
  }
  else {
    local_40 = 0.0;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSat * 1.0) / 1000000.0,local_40);
  Abc_Print(1,"%s ="," Sat  ");
  if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
    local_50 = ((double)p->timeSatSat * 100.0) / (double)p->timeTotal;
  }
  else {
    local_50 = 0.0;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSatSat * 1.0) / 1000000.0,local_50);
  Abc_Print(1,"%s ="," Unsat");
  if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
    local_60 = ((double)p->timeSatUns * 100.0) / (double)p->timeTotal;
  }
  else {
    local_60 = 0.0;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSatUns * 1.0) / 1000000.0,local_60);
  Abc_Print(1,"%s ="," Undec");
  if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
    local_70 = ((double)p->timeSatUnd * 100.0) / (double)p->timeTotal;
  }
  else {
    local_70 = 0.0;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSatUnd * 1.0) / 1000000.0,local_70);
  Abc_Print(1,"%s =","Timing");
  if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
    local_80 = ((double)p->timeTime * 100.0) / (double)p->timeTotal;
  }
  else {
    local_80 = 0.0;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeTime * 1.0) / 1000000.0,local_80);
  Abc_Print(1,"%s =","Other ");
  if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
    local_90 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
  }
  else {
    local_90 = 0.0;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeOther * 1.0) / 1000000.0,local_90);
  Abc_Print(1,"%s =","ALL   ");
  if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
    local_a0 = ((double)p->timeTotal * 100.0) / (double)p->timeTotal;
  }
  else {
    local_a0 = 0.0;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeTotal * 1.0) / 1000000.0,local_a0);
  return;
}

Assistant:

void Sbl_ManPrintRuntime( Sbl_Man_t * p )
{
    printf( "Runtime breakdown:\n" );
    p->timeOther = p->timeTotal - p->timeWin - p->timeCut - p->timeSat - p->timeTime;
    ABC_PRTP( "Win   ", p->timeWin  ,   p->timeTotal );
    ABC_PRTP( "Cut   ", p->timeCut  ,   p->timeTotal );
    ABC_PRTP( "Sat   ", p->timeSat,     p->timeTotal );
    ABC_PRTP( " Sat  ", p->timeSatSat,  p->timeTotal );
    ABC_PRTP( " Unsat", p->timeSatUns,  p->timeTotal );
    ABC_PRTP( " Undec", p->timeSatUnd,  p->timeTotal );
    ABC_PRTP( "Timing", p->timeTime ,   p->timeTotal );
    ABC_PRTP( "Other ", p->timeOther,   p->timeTotal );
    ABC_PRTP( "ALL   ", p->timeTotal,   p->timeTotal );
}